

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom-window.cc
# Opt level: O0

void __thiscall Debugger::ROMWindow::ROMWindow(ROMWindow *this,Debugger *d)

{
  Debugger *d_local;
  ROMWindow *this_local;
  
  Window::Window(&this->super_Window,d);
  this->rom_texture = (HostTexture *)0x0;
  this->rom_texture_width = 0;
  this->rom_texture_height = 0;
  this->scale = 1;
  this->counter = 0x3c;
  return;
}

Assistant:

Debugger::ROMWindow::ROMWindow(Debugger* d) : Window(d) {}